

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O3

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::stop(AsyncQueue<nrg::PrioExecution> *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/detail/AsyncQueue.h:54:42)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/detail/AsyncQueue.h:54:42)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  operator()(this,(function<void_()> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void stop()
    {
        typename AsyncStyle::Function fn([this]() {running_ = false; });
        (*this)(std::move(fn));
    }